

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strnid.cc
# Opt level: O1

int ASN1_STRING_TABLE_add(int param_1,long param_2,long param_3,ulong param_4,ulong param_5)

{
  int iVar1;
  ASN1_STRING_TABLE *pAVar2;
  void *pvVar3;
  int *data;
  int iVar4;
  ASN1_STRING_TABLE key;
  void *local_58 [5];
  
  pAVar2 = asn1_string_table_get(param_1);
  if (pAVar2 != (ASN1_STRING_TABLE *)0x0) {
    ERR_put_error(0xc,0,0x42,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_strnid.cc"
                  ,0x99);
    return 0;
  }
  CRYPTO_MUTEX_lock_write(&string_tables_lock);
  if (string_tables == (lhash_st_ASN1_STRING_TABLE *)0x0) {
    string_tables = (lhash_st_ASN1_STRING_TABLE *)OPENSSL_lh_new(table_hash,table_cmp);
    if ((_LHASH *)string_tables == (_LHASH *)0x0) {
      iVar4 = 0;
      goto LAB_00311969;
    }
  }
  else {
    local_58[0] = (void *)CONCAT44(local_58[0]._4_4_,param_1);
    pvVar3 = OPENSSL_lh_retrieve((_LHASH *)string_tables,local_58,
                                 lh_ASN1_STRING_TABLE_call_hash_func,
                                 lh_ASN1_STRING_TABLE_call_cmp_func);
    if (pvVar3 != (void *)0x0) {
      iVar4 = 0;
      ERR_put_error(0xc,0,0x42,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_strnid.cc"
                    ,0xac);
      goto LAB_00311969;
    }
  }
  data = (int *)OPENSSL_malloc(0x28);
  iVar4 = 0;
  if (data != (int *)0x0) {
    *data = param_1;
    *(ulong *)(data + 8) = param_5;
    *(long *)(data + 2) = param_2;
    *(long *)(data + 4) = param_3;
    *(ulong *)(data + 6) = param_4;
    local_58[0] = (void *)0x0;
    iVar1 = OPENSSL_lh_insert((_LHASH *)string_tables,local_58,data,
                              lh_ASN1_STRING_TABLE_call_hash_func,lh_ASN1_STRING_TABLE_call_cmp_func
                             );
    if (iVar1 == 0) {
      OPENSSL_free(data);
    }
    else {
      iVar4 = 1;
      if (local_58[0] != (void *)0x0) {
        __assert_fail("old_tbl == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_strnid.cc"
                      ,0xc0,
                      "int ASN1_STRING_TABLE_add(int, long, long, unsigned long, unsigned long)");
      }
    }
  }
LAB_00311969:
  CRYPTO_MUTEX_unlock_write(&string_tables_lock);
  return iVar4;
}

Assistant:

int ASN1_STRING_TABLE_add(int nid, long minsize, long maxsize,
                          unsigned long mask, unsigned long flags) {
  // Existing entries cannot be overwritten.
  if (asn1_string_table_get(nid) != NULL) {
    OPENSSL_PUT_ERROR(ASN1, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
    return 0;
  }

  int ret = 0;
  CRYPTO_MUTEX_lock_write(&string_tables_lock);

  ASN1_STRING_TABLE *tbl = NULL;
  if (string_tables == NULL) {
    string_tables = lh_ASN1_STRING_TABLE_new(table_hash, table_cmp);
    if (string_tables == NULL) {
      goto err;
    }
  } else {
    // Check again for an existing entry. One may have been added while
    // unlocked.
    ASN1_STRING_TABLE key;
    key.nid = nid;
    if (lh_ASN1_STRING_TABLE_retrieve(string_tables, &key) != NULL) {
      OPENSSL_PUT_ERROR(ASN1, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
      goto err;
    }
  }

  tbl = reinterpret_cast<ASN1_STRING_TABLE *>(
      OPENSSL_malloc(sizeof(ASN1_STRING_TABLE)));
  if (tbl == NULL) {
    goto err;
  }
  tbl->nid = nid;
  tbl->flags = flags;
  tbl->minsize = minsize;
  tbl->maxsize = maxsize;
  tbl->mask = mask;
  ASN1_STRING_TABLE *old_tbl;
  if (!lh_ASN1_STRING_TABLE_insert(string_tables, &old_tbl, tbl)) {
    OPENSSL_free(tbl);
    goto err;
  }
  assert(old_tbl == NULL);
  ret = 1;

err:
  CRYPTO_MUTEX_unlock_write(&string_tables_lock);
  return ret;
}